

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void WindowDropCallback(GLFWwindow *window,int count,char **paths)

{
  char *pcVar1;
  ulong uVar2;
  
  ClearDroppedFiles();
  CORE.Window.dropFilesPath = (char **)malloc((long)count * 8);
  if (0 < count) {
    uVar2 = 0;
    do {
      pcVar1 = (char *)malloc(0x1000);
      CORE.Window.dropFilesPath[uVar2] = pcVar1;
      strcpy(CORE.Window.dropFilesPath[uVar2],paths[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)count != uVar2);
  }
  CORE.Window.dropFilesCount = count;
  return;
}

Assistant:

static void WindowDropCallback(GLFWwindow *window, int count, const char **paths)
{
    ClearDroppedFiles();

    CORE.Window.dropFilesPath = (char **)RL_MALLOC(sizeof(char *)*count);

    for (int i = 0; i < count; i++)
    {
        CORE.Window.dropFilesPath[i] = (char *)RL_MALLOC(sizeof(char)*MAX_FILEPATH_LENGTH);
        strcpy(CORE.Window.dropFilesPath[i], paths[i]);
    }

    CORE.Window.dropFilesCount = count;
}